

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Settings::BoolParam::BoolParam(BoolParam *this)

{
  long lVar1;
  
  lVar1 = 0x10;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x350);
  lVar1 = 0x350;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x690);
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)this->description);
  this->defaultValue[0] = false;
  std::__cxx11::string::assign((char *)(this->name + 1));
  std::__cxx11::string::assign((char *)(this->description + 1));
  this->defaultValue[1] = false;
  std::__cxx11::string::assign((char *)(this->name + 2));
  std::__cxx11::string::assign((char *)(this->description + 2));
  this->defaultValue[2] = false;
  std::__cxx11::string::assign((char *)(this->name + 3));
  std::__cxx11::string::assign((char *)(this->description + 3));
  this->defaultValue[3] = true;
  std::__cxx11::string::assign((char *)(this->name + 4));
  std::__cxx11::string::assign((char *)(this->description + 4));
  this->defaultValue[4] = false;
  std::__cxx11::string::assign((char *)(this->name + 5));
  std::__cxx11::string::assign((char *)(this->description + 5));
  this->defaultValue[5] = true;
  std::__cxx11::string::assign((char *)(this->name + 6));
  std::__cxx11::string::assign((char *)(this->description + 6));
  this->defaultValue[6] = true;
  std::__cxx11::string::assign((char *)(this->name + 7));
  std::__cxx11::string::assign((char *)(this->description + 7));
  this->defaultValue[7] = false;
  std::__cxx11::string::assign((char *)(this->name + 8));
  std::__cxx11::string::assign((char *)(this->description + 8));
  this->defaultValue[8] = false;
  std::__cxx11::string::assign((char *)(this->name + 9));
  std::__cxx11::string::assign((char *)(this->description + 9));
  this->defaultValue[9] = true;
  std::__cxx11::string::assign((char *)(this->name + 10));
  std::__cxx11::string::assign((char *)(this->description + 10));
  this->defaultValue[10] = false;
  std::__cxx11::string::assign((char *)(this->name + 0xb));
  std::__cxx11::string::assign((char *)(this->description + 0xb));
  this->defaultValue[0xb] = false;
  std::__cxx11::string::assign((char *)(this->name + 0xc));
  std::__cxx11::string::assign((char *)(this->description + 0xc));
  this->defaultValue[0xc] = false;
  std::__cxx11::string::assign((char *)(this->name + 0xd));
  std::__cxx11::string::assign((char *)(this->description + 0xd));
  this->defaultValue[0xd] = true;
  std::__cxx11::string::assign((char *)(this->name + 0xe));
  std::__cxx11::string::assign((char *)(this->description + 0xe));
  this->defaultValue[0xe] = true;
  std::__cxx11::string::assign((char *)(this->name + 0xf));
  std::__cxx11::string::assign((char *)(this->description + 0xf));
  this->defaultValue[0xf] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x10));
  std::__cxx11::string::assign((char *)(this->description + 0x10));
  this->defaultValue[0x10] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x11));
  std::__cxx11::string::assign((char *)(this->description + 0x11));
  this->defaultValue[0x11] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x12));
  std::__cxx11::string::assign((char *)(this->description + 0x12));
  this->defaultValue[0x12] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x13));
  std::__cxx11::string::assign((char *)(this->description + 0x13));
  this->defaultValue[0x13] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x14));
  std::__cxx11::string::assign((char *)(this->description + 0x14));
  this->defaultValue[0x14] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x15));
  std::__cxx11::string::assign((char *)(this->description + 0x15));
  this->defaultValue[0x15] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x16));
  std::__cxx11::string::assign((char *)(this->description + 0x16));
  this->defaultValue[0x16] = false;
  std::__cxx11::string::assign((char *)(this->name + 0x17));
  std::__cxx11::string::assign((char *)(this->description + 0x17));
  this->defaultValue[0x17] = false;
  std::__cxx11::string::assign((char *)(this->name + 0x18));
  std::__cxx11::string::assign((char *)(this->description + 0x18));
  this->defaultValue[0x18] = true;
  std::__cxx11::string::assign((char *)(this->name + 0x19));
  std::__cxx11::string::assign((char *)(this->description + 0x19));
  this->defaultValue[0x19] = false;
  return;
}

Assistant:

SoPlexBase<R>::Settings::BoolParam::BoolParam()
{
   // should lifting be used to reduce range of nonzero matrix coefficients?
   name[SoPlexBase<R>::LIFTING] = "lifting";
   description[SoPlexBase<R>::LIFTING] =
      "should lifting be used to reduce range of nonzero matrix coefficients?";
   defaultValue[SoPlexBase<R>::LIFTING] = false;

   // should LP be transformed to equality form before a rational solve?
   name[SoPlexBase<R>::EQTRANS] = "eqtrans";
   description[SoPlexBase<R>::EQTRANS] =
      "should LP be transformed to equality form before a rational solve?";
   defaultValue[SoPlexBase<R>::EQTRANS] = false;

   // should dual infeasibility be tested in order to try to return a dual solution even if primal infeasible?
   name[SoPlexBase<R>::TESTDUALINF] = "testdualinf";
   description[SoPlexBase<R>::TESTDUALINF] =
      "should dual infeasibility be tested in order to try to return a dual solution even if primal infeasible?";
   defaultValue[SoPlexBase<R>::TESTDUALINF] = false;

   // should a rational factorization be performed after iterative refinement?
   name[SoPlexBase<R>::RATFAC] = "ratfac";
   description[SoPlexBase<R>::RATFAC] =
      "should a rational factorization be performed after iterative refinement?";
   defaultValue[SoPlexBase<R>::RATFAC] = true;

   // should cycling solutions be accepted during iterative refinement?
   name[SoPlexBase<R>::ACCEPTCYCLING] = "acceptcycling";
   description[SoPlexBase<R>::ACCEPTCYCLING] =
      "should cycling solutions be accepted during iterative refinement?";
   defaultValue[SoPlexBase<R>::ACCEPTCYCLING] = false;

   // apply rational reconstruction after each iterative refinement?
   name[SoPlexBase<R>::RATREC] = "ratrec";
   description[SoPlexBase<R>::RATREC] =
      "apply rational reconstruction after each iterative refinement?";
   defaultValue[SoPlexBase<R>::RATREC] = true;

   // round scaling factors for iterative refinement to powers of two?
   name[SoPlexBase<R>::POWERSCALING] = "powerscaling";
   description[SoPlexBase<R>::POWERSCALING] =
      "round scaling factors for iterative refinement to powers of two?";
   defaultValue[SoPlexBase<R>::POWERSCALING] = true;

   // continue iterative refinement with exact basic solution if not optimal?
   name[SoPlexBase<R>::RATFACJUMP] = "ratfacjump";
   description[SoPlexBase<R>::RATFACJUMP] =
      "continue iterative refinement with exact basic solution if not optimal?";
   defaultValue[SoPlexBase<R>::RATFACJUMP] = false;

   // use bound flipping also for row representation?
   name[SoPlexBase<R>::ROWBOUNDFLIPS] = "rowboundflips";
   description[SoPlexBase<R>::ROWBOUNDFLIPS] = "use bound flipping also for row representation?";
   defaultValue[SoPlexBase<R>::ROWBOUNDFLIPS] = false;

   // use persistent scaling?
   name[SoPlexBase<R>::PERSISTENTSCALING] = "persistentscaling";
   description[SoPlexBase<R>::PERSISTENTSCALING] = "should persistent scaling be used?";
   defaultValue[SoPlexBase<R>::PERSISTENTSCALING] = true;

   // perturb the entire problem or only the relevant bounds of s single pivot?
   name[SoPlexBase<R>::FULLPERTURBATION] = "fullperturbation";
   description[SoPlexBase<R>::FULLPERTURBATION] =
      "should perturbation be applied to the entire problem?";
   defaultValue[SoPlexBase<R>::FULLPERTURBATION] = false;

   /// re-optimize the original problem to get a proof of infeasibility/unboundedness?
   name[SoPlexBase<R>::ENSURERAY] = "ensureray";
   description[SoPlexBase<R>::ENSURERAY] =
      "re-optimize the original problem to get a proof (ray) of infeasibility/unboundedness?";
   defaultValue[SoPlexBase<R>::ENSURERAY] = false;

   /// try to enforce that the optimal solution is a basic solution
   name[SoPlexBase<Real>::FORCEBASIC] = "forcebasic";
   description[SoPlexBase<Real>::FORCEBASIC] =
      "try to enforce that the optimal solution is a basic solution";
   defaultValue[SoPlexBase<Real>::FORCEBASIC] = false;

   name[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] = "simplifier_enable_singletoncols";
   description[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] =
      "enable presolver SingletonCols in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] = true;

   name[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] = "simplifier_enable_propagation";
   description[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] =
      "enable presolver ConstraintPropagation in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] = "simplifier_enable_parallelrows";
   description[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] =
      "enable presolver ParallelRowDetection in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] = "simplifier_enable_parallelcols";
   description[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] =
      "enable presolver ParallelColDetection in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] = "simplifier_enable_stuffing";
   description[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] =
      "enable presolver SingletonStuffing in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] = true;

   name[SoPlexBase<R>::SIMPLIFIER_DUALFIX] = "simplifier_enable_dualfix";
   description[SoPlexBase<R>::SIMPLIFIER_DUALFIX] =
      "enable presolver DualFix in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_DUALFIX] = true;

   name[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] = "simplifier_enable_fixcontinuous";
   description[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] =
      "enable presolver FixContinuous in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] = true;

   name[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] = "simplifier_enable_domcol";
   description[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] =
      "enable presolver DominatedCols in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] = true;

   name[SoPlexBase<R>::ITERATIVE_REFINEMENT] = "iterative_refinement";
   description[SoPlexBase<R>::ITERATIVE_REFINEMENT] =
      "enable iterative refinement";
   defaultValue[SoPlexBase<R>::ITERATIVE_REFINEMENT] = true;

   // adapt tolerances to the multiprecision used
   name[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] = "adapt_tols_to_multiprecision";
   description[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] =
      "adapt tolerances to the multiprecision used";
   defaultValue[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] = false;

   name[SoPlexBase<R>::PRECISION_BOOSTING] = "precision_boosting";
   description[SoPlexBase<R>::PRECISION_BOOSTING] =
      "enable precision boosting";
#ifdef SOPLEX_WITH_MPFR
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING] = true;
#else
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING] = false;
#endif

   name[SoPlexBase<R>::BOOSTED_WARM_START] = "boosted_warm_start";
   description[SoPlexBase<R>::BOOSTED_WARM_START] =
      "if true, boosted solver starts from last basis, otherwise from slack basis";
   defaultValue[SoPlexBase<R>::BOOSTED_WARM_START] = true;

   name[SoPlexBase<R>::RECOVERY_MECHANISM] = "recovery_mechanism";
   description[SoPlexBase<R>::RECOVERY_MECHANISM] =
      "enable recovery mechanism for when the solve fails";
   defaultValue[SoPlexBase<R>::RECOVERY_MECHANISM] = false;
}